

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

QLinearGradient *
qt_fusion_gradient(QLinearGradient *__return_storage_ptr__,QRect *rect,QBrush *baseColor,
                  Direction direction)

{
  undefined8 uVar1;
  QPoint QVar2;
  QPoint QVar3;
  long lVar4;
  undefined8 *puVar5;
  QLinearGradient *pQVar6;
  long in_FS_OFFSET;
  byte bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  QGradient local_90;
  long local_38;
  
  bVar7 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = QRect::center(rect);
  QVar3 = QRect::center(rect);
  puVar5 = &DAT_00655238;
  pQVar6 = __return_storage_ptr__;
  for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar1 = *puVar5;
    (pQVar6->super_QGradient).m_type = (int)uVar1;
    (pQVar6->super_QGradient).m_spread = (int)((ulong)uVar1 >> 0x20);
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    pQVar6 = (QLinearGradient *)((long)pQVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  QLinearGradient::QLinearGradient(__return_storage_ptr__);
  if (direction == FromLeft) {
    dVar8 = (double)(rect->x1).m_i;
    dVar9 = (double)QVar3.yp.m_i.m_i;
    dVar10 = (double)(rect->x2).m_i;
    dVar11 = dVar9;
  }
  else {
    dVar8 = (double)QVar2.xp.m_i.m_i;
    dVar9 = (double)(rect->y1).m_i;
    dVar11 = (double)(rect->y2).m_i;
    dVar10 = dVar8;
  }
  QLinearGradient::QLinearGradient((QLinearGradient *)&local_90,dVar8,dVar9,dVar10,dVar11);
  QGradient::operator=(&__return_storage_ptr__->super_QGradient,&local_90);
  QLinearGradient::~QLinearGradient((QLinearGradient *)&local_90);
  lVar4 = QBrush::gradient();
  if (lVar4 == 0) {
    local_90.m_stops.d.d._4_4_ = 0xaaaaaaaa;
    auVar12 = QColor::lighter((int)*(undefined8 *)baseColor + 8);
    local_90._0_8_ = auVar12._0_8_;
    local_90.m_stops.d.d._0_4_ = auVar12._8_4_;
    local_90.m_stops.d.d._4_4_ = CONCAT22(local_90.m_stops.d.d._6_2_,auVar12._12_2_);
    QColor::lighter((int)*(undefined8 *)baseColor + 8);
    QGradient::setColorAt(0.0,(QColor *)__return_storage_ptr__);
    QGradient::setColorAt(1.0,(QColor *)__return_storage_ptr__);
  }
  else {
    QBrush::gradient();
    QGradient::stops();
    QGradient::setStops((QList_conflict *)__return_storage_ptr__);
    QArrayDataPointer<std::pair<double,_QColor>_>::~QArrayDataPointer
              ((QArrayDataPointer<std::pair<double,_QColor>_> *)&local_90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QLinearGradient qt_fusion_gradient(const QRect &rect, const QBrush &baseColor, Direction direction = TopDown)
{
    int x = rect.center().x();
    int y = rect.center().y();
    QLinearGradient gradient;
    switch (direction) {
    case FromLeft:
        gradient = QLinearGradient(rect.left(), y, rect.right(), y);
        break;
    case FromRight:
        gradient = QLinearGradient(rect.right(), y, rect.left(), y);
        break;
    case BottomUp:
        gradient = QLinearGradient(x, rect.bottom(), x, rect.top());
        break;
    case TopDown:
    default:
        gradient = QLinearGradient(x, rect.top(), x, rect.bottom());
        break;
    }
    if (baseColor.gradient())
        gradient.setStops(baseColor.gradient()->stops());
    else {
        QColor gradientStartColor = baseColor.color().lighter(124);
        QColor gradientStopColor = baseColor.color().lighter(102);
        gradient.setColorAt(0, gradientStartColor);
        gradient.setColorAt(1, gradientStopColor);
        //          Uncomment for adding shiny shading
        //            QColor midColor1 = mergedColors(gradientStartColor, gradientStopColor, 55);
        //            QColor midColor2 = mergedColors(gradientStartColor, gradientStopColor, 45);
        //            gradient.setColorAt(0.5, midColor1);
        //            gradient.setColorAt(0.501, midColor2);
    }
    return gradient;
}